

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitLargeMeshes.cpp
# Opt level: O0

void __thiscall
Assimp::SplitLargeMeshesProcess_Vertex::Execute
          (SplitLargeMeshesProcess_Vertex *this,aiScene *pScene)

{
  undefined1 auVar1 [16];
  Logger *pLVar2;
  size_type sVar3;
  ulong uVar4;
  void *pvVar5;
  reference pvVar6;
  uint local_50;
  uint i;
  uint local_3c;
  uint a_1;
  undefined1 local_30 [4];
  uint a;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  avList;
  aiScene *pScene_local;
  SplitLargeMeshesProcess_Vertex *this_local;
  
  if ((this->LIMIT != 0xffffffff) && (pScene != (aiScene *)0x0)) {
    avList.
    super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pScene;
    pLVar2 = DefaultLogger::get();
    Logger::debug(pLVar2,"SplitLargeMeshesProcess_Vertex begin");
    std::
    vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>::
    vector((vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
            *)local_30);
    for (a_1 = 0; a_1 < *(uint *)&avList.
                                  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage[1].first;
        a_1 = a_1 + 1) {
      if (**(int **)(*(long *)&avList.
                               super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage[1].second +
                    (ulong)a_1 * 8) == 1) goto LAB_005c4cb1;
    }
    for (local_3c = 0;
        local_3c <
        *(uint *)&avList.
                  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage[1].first;
        local_3c = local_3c + 1) {
      SplitMesh(this,local_3c,
                *(aiMesh **)
                 (*(long *)&avList.
                            super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage[1].second +
                 (ulong)local_3c * 8),
                (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                 *)local_30);
    }
    sVar3 = std::
            vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
            ::size((vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                    *)local_30);
    if (sVar3 == *(uint *)&avList.
                           super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage[1].first) {
      pLVar2 = DefaultLogger::get();
      Logger::debug(pLVar2,"SplitLargeMeshesProcess_Vertex finished. There was nothing to do");
    }
    else {
      if (*(void **)&avList.
                     super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[1].second != (void *)0x0) {
        operator_delete__(*(void **)&avList.
                                     super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage[1].second);
      }
      sVar3 = std::
              vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
              ::size((vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                      *)local_30);
      *(int *)&avList.
               super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[1].first = (int)sVar3;
      sVar3 = std::
              vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
              ::size((vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                      *)local_30);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = sVar3;
      uVar4 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      pvVar5 = operator_new__(uVar4);
      *(void **)&avList.
                 super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage[1].second = pvVar5;
      for (local_50 = 0;
          sVar3 = std::
                  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                  ::size((vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                          *)local_30), local_50 < sVar3; local_50 = local_50 + 1) {
        pvVar6 = std::
                 vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                 ::operator[]((vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                               *)local_30,(ulong)local_50);
        *(aiMesh **)
         (*(long *)&avList.
                    super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage[1].second +
         (ulong)local_50 * 8) = pvVar6->first;
      }
      SplitLargeMeshesProcess_Triangle::UpdateNode
                (*(aiNode **)
                  &(avList.
                    super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->second,
                 (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                  *)local_30);
      pLVar2 = DefaultLogger::get();
      Logger::info(pLVar2,"SplitLargeMeshesProcess_Vertex finished. Meshes have been split");
    }
LAB_005c4cb1:
    std::
    vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>::
    ~vector((vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
             *)local_30);
  }
  return;
}

Assistant:

void SplitLargeMeshesProcess_Vertex::Execute( aiScene* pScene) {
    if (0xffffffff == this->LIMIT || nullptr == pScene ) {
        return;
    }

    ASSIMP_LOG_DEBUG("SplitLargeMeshesProcess_Vertex begin");

    std::vector<std::pair<aiMesh*, unsigned int> > avList;

    //Check for point cloud first, 
    //Do not process point cloud, splitMesh works only with faces data
    for (unsigned int a = 0; a < pScene->mNumMeshes; a++) {
        if ( pScene->mMeshes[a]->mPrimitiveTypes == aiPrimitiveType_POINT ) {
            return;
        }
    }

    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a ) {
        this->SplitMesh(a, pScene->mMeshes[a], avList);
    }

    if (avList.size() != pScene->mNumMeshes) {
        // it seems something has been split. rebuild the mesh list
        delete[] pScene->mMeshes;
        pScene->mNumMeshes = (unsigned int)avList.size();
        pScene->mMeshes = new aiMesh*[avList.size()];

        for (unsigned int i = 0; i < avList.size();++i) {
            pScene->mMeshes[i] = avList[i].first;
        }

        // now we need to update all nodes
        SplitLargeMeshesProcess_Triangle::UpdateNode(pScene->mRootNode,avList);
        ASSIMP_LOG_INFO("SplitLargeMeshesProcess_Vertex finished. Meshes have been split");
    } else {
        ASSIMP_LOG_DEBUG("SplitLargeMeshesProcess_Vertex finished. There was nothing to do");
    }
}